

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

charcount_t Js::FunctionBody::SkipByteOrderMark(LPCUTF8 *documentStart)

{
  utf8char_t uVar1;
  LPCUTF8 puVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  
  if (*documentStart == (LPCUTF8)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xa59,"(documentStart != nullptr)","documentStart != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  puVar2 = *documentStart;
  uVar1 = *puVar2;
  if (uVar1 == 0xff) {
    lVar6 = 2;
    if (puVar2[1] != 0xfe) {
      return 0;
    }
  }
  else if (uVar1 == 0xfe) {
    if (puVar2[1] != 0xff) {
      return 0;
    }
    lVar6 = 2;
  }
  else {
    if (uVar1 != 0xef) {
      return 0;
    }
    if (puVar2[1] != 0xbb) {
      return 0;
    }
    lVar6 = 3;
    if (puVar2[2] != 0xbf) {
      return 0;
    }
  }
  *documentStart = puVar2 + lVar6;
  return 1;
}

Assistant:

static charcount_t SkipByteOrderMark(__in_bcount_z(4) LPCUTF8& documentStart)
        {
            charcount_t retValue = 0;

            Assert(documentStart != nullptr);

            if (documentStart[0] == 0xEF &&
                documentStart[1] == 0xBB &&
                documentStart[2] == 0xBF)
            {
                // UTF-8     - EF BB BF
                // 3 bytes skipped - reports one char skipped
                documentStart += 3;
                retValue = 1;
            }
            else if ((documentStart[0] == 0xFF && documentStart[1] == 0xFE) ||
                    (documentStart[0] == 0xFE && documentStart[1] == 0xFF))
            {
                // UTF-16 LE - FF FE
                // UTF-16 BE - FE FF
                // 2 bytes skipped - reports one char skipped
                documentStart += 2;
                retValue = 1;
            }

            return retValue;
        }